

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

int Gia_Iso2ManUniqify(Gia_Iso2Man_t *p)

{
  uint uVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Gia_Man_t *pGVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  void **ppvVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  Vec_Ptr_t *pVVar13;
  int Entry;
  uint uVar14;
  long lVar15;
  long lVar16;
  
  piVar2 = p->vTable->pArray;
  uVar11 = p->vTable->nSize;
  p->vPlaces->nSize = 0;
  pVVar10 = p->vTied;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      iVar8 = pVVar10->pArray[lVar16];
      lVar15 = (long)iVar8;
      if (lVar15 < 0) goto LAB_00755fb7;
      uVar14 = p->pGia->nObjs;
      if ((int)uVar14 <= iVar8) goto LAB_00755fb7;
      pGVar3 = p->pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar12 = (ulong)pGVar3[lVar15].Value % (ulong)uVar11;
      while( true ) {
        Entry = (int)uVar12;
        uVar1 = piVar2[Entry];
        if (uVar1 == 0) break;
        if (((int)uVar1 < 0) || (uVar14 <= uVar1)) goto LAB_00755fb7;
        if (pGVar3[uVar1].Value == pGVar3[lVar15].Value) {
          pGVar3[uVar1].field_0x3 = pGVar3[uVar1].field_0x3 | 0x40;
          pGVar3[lVar15].field_0x3 = pGVar3[lVar15].field_0x3 | 0x40;
          goto LAB_00755d3e;
        }
        uVar12 = (long)(Entry + 1) % (long)(int)uVar11 & 0xffffffff;
      }
      piVar2[Entry] = iVar8;
      Vec_IntPush(p->vPlaces,Entry);
LAB_00755d3e:
      lVar16 = lVar16 + 1;
      pVVar10 = p->vTied;
    } while (lVar16 < pVVar10->nSize);
    pVVar4 = p->vPlaces;
    if (0 < pVVar4->nSize) {
      piVar5 = pVVar4->pArray;
      lVar16 = 0;
      do {
        piVar2[piVar5[lVar16]] = 0;
        lVar16 = lVar16 + 1;
      } while (lVar16 < pVVar4->nSize);
    }
  }
  p->vSingles->nSize = 0;
  uVar11 = pVVar10->nSize;
  uVar12 = (ulong)uVar11;
  if (0 < (int)uVar11) {
    lVar16 = 0;
    uVar14 = 0;
    do {
      uVar11 = (uint)uVar12;
      iVar8 = pVVar10->pArray[lVar16];
      if (((long)iVar8 < 0) || (p->pGia->nObjs <= iVar8)) {
LAB_00755fb7:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) goto LAB_00755edd;
      pGVar3 = pGVar3 + iVar8;
      if (((uint)*(ulong *)pGVar3 >> 0x1e & 1) == 0) {
        pVVar13 = p->vSingles;
        uVar11 = pVVar13->nSize;
        if (uVar11 == pVVar13->nCap) {
          if ((int)uVar11 < 0x10) {
            if (pVVar13->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar13->pArray,0x80);
            }
            pVVar13->pArray = ppvVar9;
            pVVar13->nCap = 0x10;
          }
          else {
            if (pVVar13->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar11 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar13->pArray,(ulong)uVar11 << 4);
            }
            pVVar13->pArray = ppvVar9;
            pVVar13->nCap = uVar11 * 2;
          }
        }
        else {
          ppvVar9 = pVVar13->pArray;
        }
        iVar8 = pVVar13->nSize;
        pVVar13->nSize = iVar8 + 1;
        ppvVar9[iVar8] = pGVar3;
        pVVar10 = p->vTied;
      }
      else {
        *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xffffffffbfffffff;
        pGVar7 = p->pGia->pObjs;
        if ((pGVar3 < pGVar7) || (pGVar7 + p->pGia->nObjs <= pGVar3)) goto LAB_00755fd6;
        if (((int)uVar14 < 0) || (pVVar10 = p->vTied, pVVar10->nSize <= (int)uVar14)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar12 = (ulong)uVar14;
        uVar14 = uVar14 + 1;
        pVVar10->pArray[uVar12] = (int)((ulong)((long)pGVar3 - (long)pGVar7) >> 2) * -0x55555555;
      }
      lVar16 = lVar16 + 1;
      uVar11 = pVVar10->nSize;
      uVar12 = (ulong)(int)uVar11;
      if ((long)uVar12 <= lVar16) goto LAB_00755edd;
    } while( true );
  }
  uVar14 = 0;
LAB_00755edd:
  if ((int)uVar11 < (int)uVar14) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar10->nSize = uVar14;
  pVVar13 = p->vSingles;
  iVar8 = pVVar13->nSize;
  if (1 < (long)iVar8) {
    qsort(pVVar13->pArray,(long)iVar8,8,Gia_ObjCompareByValue2);
    pVVar13 = p->vSingles;
    iVar8 = pVVar13->nSize;
  }
  if (0 < iVar8) {
    ppvVar9 = pVVar13->pArray;
    pGVar6 = p->pGia;
    pVVar10 = p->vUniques;
    pGVar3 = pGVar6->pObjs;
    lVar16 = 0;
    do {
      pGVar7 = (Gia_Obj_t *)ppvVar9[lVar16];
      uVar11 = p->nUniques;
      pGVar7->Value = pGVar7->Value + s_256Primes[uVar11 & 0xff];
      if ((pGVar7 < pGVar3) || (pGVar3 + pGVar6->nObjs <= pGVar7)) {
LAB_00755fd6:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar14 = (int)((long)pGVar7 - (long)pGVar3 >> 2) * -0x55555555;
      if (((int)uVar14 < 0) || (pVVar10->nSize <= (int)uVar14)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = pVVar10->pArray;
      if (piVar2[uVar14 & 0x7fffffff] != -1) {
        __assert_fail("Vec_IntEntry(p->vUniques, Gia_ObjId(p->pGia, pObj)) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso2.c"
                      ,0x150,"int Gia_Iso2ManUniqify(Gia_Iso2Man_t *)");
      }
      p->nUniques = uVar11 + 1;
      piVar2[uVar14 & 0x7fffffff] = uVar11;
      lVar16 = lVar16 + 1;
      iVar8 = pVVar13->nSize;
    } while (lVar16 < iVar8);
  }
  return iVar8;
}

Assistant:

int Gia_Iso2ManUniqify( Gia_Iso2Man_t * p )
{
    int fVerify = 0;
    Gia_Obj_t * pObj, * pTemp;
    int * pTable = Vec_IntArray(p->vTable);
    int i, k, nSize = Vec_IntSize(p->vTable);

    if ( fVerify )
        for ( k = 0; k < nSize; k++ )
            assert( pTable[k] == 0 );
    if ( fVerify )
        Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
            assert( pObj->fMark0 == 0 );

#if 0
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
    {
        printf( "%3d : ", Gia_ObjId(p->pGia, pObj) );
        Extra_PrintBinary( stdout, &pObj->Value, 32 );
        printf( "\n" );
    }
#endif

    // add objects to the table
    Vec_IntClear( p->vPlaces );
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
    {
        for ( k = pObj->Value % nSize; (pTemp = pTable[k] ? Gia_ManObj(p->pGia, pTable[k]) : NULL); k = (k + 1) % nSize )
            if ( pTemp->Value == pObj->Value )
            {
                pTemp->fMark0 = 1;
                pObj->fMark0 = 1;
                break;
            }
        if ( pTemp != NULL )
            continue;
        pTable[k] = Gia_ObjId(p->pGia, pObj);
        Vec_IntPush( p->vPlaces, k );
    }
    // clean the table
    Vec_IntForEachEntry( p->vPlaces, k, i )
        pTable[k] = 0;
    // collect singleton objects and compact tied objects
    k = 0;
    Vec_PtrClear( p->vSingles );
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
        if ( pObj->fMark0 == 0 )
            Vec_PtrPush( p->vSingles, pObj );
        else 
        {
            pObj->fMark0 = 0;
            Vec_IntWriteEntry( p->vTied, k++, Gia_ObjId(p->pGia, pObj) );
        }
    Vec_IntShrink( p->vTied, k );
    // sort singletons
    Vec_PtrSort( p->vSingles, (int (*)(void))Gia_ObjCompareByValue2 );
    // add them to unique and increment signature
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vSingles, pObj, i )
    {
        pObj->Value += s_256Primes[p->nUniques & ISO_MASK];
        assert( Vec_IntEntry(p->vUniques, Gia_ObjId(p->pGia, pObj)) == -1 );
        Vec_IntWriteEntry( p->vUniques, Gia_ObjId(p->pGia, pObj), p->nUniques++ );
    }
    return Vec_PtrSize( p->vSingles );
}